

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLMG.cpp
# Opt level: O0

void __thiscall amrex::MLMG::mgVcycle(MLMG *this,int amrlev,int mglev_top)

{
  long *plVar1;
  int iVar2;
  int iVar3;
  Any *pAVar4;
  Any *pAVar5;
  int in_EDX;
  int in_ESI;
  int *in_RDI;
  Real norm_7;
  int i_2;
  Real norm_6;
  int mglev_1;
  Real norm_5;
  int i_1;
  bool skip_fillboundary_1;
  Real norm_4;
  Real norm_3;
  Real norm_2;
  Real norm_1;
  int i;
  bool skip_fillboundary;
  Real norm;
  int mglev;
  int mglev_bottom;
  undefined4 in_stack_fffffffffffff0b8;
  int in_stack_fffffffffffff0bc;
  MLLinOp *in_stack_fffffffffffff0c0;
  MLMG *in_stack_fffffffffffff0d0;
  ostream *in_stack_fffffffffffff0e8;
  MLMG *in_stack_fffffffffffff0f0;
  Print *in_stack_fffffffffffff130;
  Print *in_stack_fffffffffffff178;
  MLMG *in_stack_fffffffffffff180;
  MLMG local_cc8;
  undefined8 local_9a8;
  int local_99c;
  undefined8 local_810;
  int local_808;
  byte local_801;
  undefined8 local_678;
  undefined8 local_4e8;
  undefined8 local_358;
  undefined8 local_1c8;
  int local_1bc;
  undefined1 local_1b5;
  undefined8 local_20;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  
  local_10 = in_EDX;
  local_c = in_ESI;
  local_14 = MLLinOp::NMGLevels(in_stack_fffffffffffff0c0,in_stack_fffffffffffff0bc);
  local_14 = local_14 + -1;
  for (local_18 = local_10; local_18 < local_14; local_18 = local_18 + 1) {
    if (3 < *in_RDI) {
      plVar1 = *(long **)(in_RDI + 0x12);
      Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
      ::operator[]((Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                    *)in_stack_fffffffffffff0c0,
                   CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
      pAVar4 = Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                         ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)
                          in_stack_fffffffffffff0c0,
                          CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
      local_20 = (**(code **)(*plVar1 + 400))(plVar1,pAVar4);
      OutStream();
      Print::Print((Print *)in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8);
      Print::operator<<((Print *)in_stack_fffffffffffff0c0,
                        (char (*) [10])CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8)
                       );
      Print::operator<<((Print *)in_stack_fffffffffffff0c0,
                        (int *)CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
      Print::operator<<((Print *)in_stack_fffffffffffff0c0,
                        (char (*) [2])CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8))
      ;
      Print::operator<<((Print *)in_stack_fffffffffffff0c0,
                        (int *)CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
      Print::operator<<((Print *)in_stack_fffffffffffff0c0,
                        (char (*) [27])CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8)
                       );
      Print::operator<<((Print *)in_stack_fffffffffffff0c0,
                        (double *)CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
      Print::operator<<((Print *)in_stack_fffffffffffff0c0,
                        (char (*) [2])CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8))
      ;
      Print::~Print(in_stack_fffffffffffff130);
    }
    plVar1 = *(long **)(in_RDI + 0x12);
    Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
    ::operator[]((Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                  *)in_stack_fffffffffffff0c0,
                 CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
    pAVar4 = Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                       ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)in_stack_fffffffffffff0c0
                        ,CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
    (**(code **)(*plVar1 + 0x170))(plVar1,pAVar4);
    local_1b5 = 1;
    for (local_1bc = 0; iVar3 = local_c, iVar2 = local_18, local_1bc < in_RDI[3];
        local_1bc = local_1bc + 1) {
      plVar1 = *(long **)(in_RDI + 0x12);
      Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
      ::operator[]((Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                    *)in_stack_fffffffffffff0c0,
                   CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
      pAVar4 = Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                         ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)
                          in_stack_fffffffffffff0c0,
                          CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
      Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
      ::operator[]((Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                    *)in_stack_fffffffffffff0c0,
                   CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
      pAVar5 = Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                         ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)
                          in_stack_fffffffffffff0c0,
                          CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
      (**(code **)(*plVar1 + 0x1c8))(plVar1,iVar3,iVar2,pAVar4,pAVar5);
      local_1b5 = 0;
    }
    computeResOfCorrection
              (in_stack_fffffffffffff0f0,(int)((ulong)in_stack_fffffffffffff0e8 >> 0x20),
               (int)in_stack_fffffffffffff0e8);
    if (3 < *in_RDI) {
      plVar1 = *(long **)(in_RDI + 0x12);
      Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
      ::operator[]((Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                    *)in_stack_fffffffffffff0c0,
                   CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
      pAVar4 = Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                         ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)
                          in_stack_fffffffffffff0c0,
                          CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
      local_1c8 = (**(code **)(*plVar1 + 400))(plVar1,pAVar4);
      OutStream();
      Print::Print((Print *)in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8);
      Print::operator<<((Print *)in_stack_fffffffffffff0c0,
                        (char (*) [10])CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8)
                       );
      Print::operator<<((Print *)in_stack_fffffffffffff0c0,
                        (int *)CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
      Print::operator<<((Print *)in_stack_fffffffffffff0c0,
                        (char (*) [2])CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8))
      ;
      Print::operator<<((Print *)in_stack_fffffffffffff0c0,
                        (int *)CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
      Print::operator<<((Print *)in_stack_fffffffffffff0c0,
                        (char (*) [27])CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8)
                       );
      Print::operator<<((Print *)in_stack_fffffffffffff0c0,
                        (double *)CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
      Print::operator<<((Print *)in_stack_fffffffffffff0c0,
                        (char (*) [2])CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8))
      ;
      Print::~Print(in_stack_fffffffffffff130);
    }
    iVar2 = local_c;
    plVar1 = *(long **)(in_RDI + 0x12);
    iVar3 = local_18 + 1;
    Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
    ::operator[]((Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                  *)in_stack_fffffffffffff0c0,
                 CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
    pAVar4 = Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                       ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)in_stack_fffffffffffff0c0
                        ,CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
    Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
    ::operator[]((Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                  *)in_stack_fffffffffffff0c0,
                 CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
    pAVar5 = Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                       ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)in_stack_fffffffffffff0c0
                        ,CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
    (**(code **)(*plVar1 + 0x1d0))(plVar1,iVar2,iVar3,pAVar4,pAVar5);
  }
  if (local_c == 0) {
    if (3 < *in_RDI) {
      plVar1 = *(long **)(in_RDI + 0x12);
      Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
      ::operator[]((Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                    *)in_stack_fffffffffffff0c0,
                   CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
      pAVar4 = Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                         ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)
                          in_stack_fffffffffffff0c0,
                          CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
      local_358 = (**(code **)(*plVar1 + 400))(plVar1,pAVar4);
      OutStream();
      Print::Print((Print *)in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8);
      Print::operator<<((Print *)in_stack_fffffffffffff0c0,
                        (char (*) [10])CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8)
                       );
      Print::operator<<((Print *)in_stack_fffffffffffff0c0,
                        (int *)CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
      Print::operator<<((Print *)in_stack_fffffffffffff0c0,
                        (char (*) [2])CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8))
      ;
      Print::operator<<((Print *)in_stack_fffffffffffff0c0,
                        (int *)CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
      Print::operator<<((Print *)in_stack_fffffffffffff0c0,
                        (char (*) [27])CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8)
                       );
      Print::operator<<((Print *)in_stack_fffffffffffff0c0,
                        (double *)CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
      Print::operator<<((Print *)in_stack_fffffffffffff0c0,
                        (char (*) [2])CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8))
      ;
      Print::~Print(in_stack_fffffffffffff130);
    }
    bottomSolve(in_stack_fffffffffffff0d0);
    local_99c = local_14;
    if (3 < *in_RDI) {
      computeResOfCorrection
                (in_stack_fffffffffffff0f0,(int)((ulong)in_stack_fffffffffffff0e8 >> 0x20),
                 (int)in_stack_fffffffffffff0e8);
      plVar1 = *(long **)(in_RDI + 0x12);
      Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
      ::operator[]((Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                    *)in_stack_fffffffffffff0c0,
                   CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
      pAVar4 = Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                         ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)
                          in_stack_fffffffffffff0c0,
                          CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
      local_4e8 = (**(code **)(*plVar1 + 400))(plVar1,pAVar4);
      OutStream();
      Print::Print((Print *)in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8);
      Print::operator<<((Print *)in_stack_fffffffffffff0c0,
                        (char (*) [10])CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8)
                       );
      Print::operator<<((Print *)in_stack_fffffffffffff0c0,
                        (int *)CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
      Print::operator<<((Print *)in_stack_fffffffffffff0c0,
                        (char (*) [2])CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8))
      ;
      Print::operator<<((Print *)in_stack_fffffffffffff0c0,
                        (int *)CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
      Print::operator<<((Print *)in_stack_fffffffffffff0c0,
                        (char (*) [27])CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8)
                       );
      Print::operator<<((Print *)in_stack_fffffffffffff0c0,
                        (double *)CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
      Print::operator<<((Print *)in_stack_fffffffffffff0c0,
                        (char (*) [2])CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8))
      ;
      Print::~Print(in_stack_fffffffffffff130);
      local_99c = local_14;
    }
  }
  else {
    if (3 < *in_RDI) {
      plVar1 = *(long **)(in_RDI + 0x12);
      Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
      ::operator[]((Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                    *)in_stack_fffffffffffff0c0,
                   CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
      pAVar4 = Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                         ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)
                          in_stack_fffffffffffff0c0,
                          CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
      local_678 = (**(code **)(*plVar1 + 400))(plVar1,pAVar4);
      OutStream();
      Print::Print((Print *)in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8);
      Print::operator<<((Print *)in_stack_fffffffffffff0c0,
                        (char (*) [10])CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8)
                       );
      Print::operator<<((Print *)in_stack_fffffffffffff0c0,
                        (int *)CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
      Print::operator<<((Print *)in_stack_fffffffffffff0c0,
                        (char (*) [2])CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8))
      ;
      Print::operator<<((Print *)in_stack_fffffffffffff0c0,
                        (int *)CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
      Print::operator<<((Print *)in_stack_fffffffffffff0c0,
                        (char (*) [27])CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8)
                       );
      Print::operator<<((Print *)in_stack_fffffffffffff0c0,
                        (double *)CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
      Print::operator<<((Print *)in_stack_fffffffffffff0c0,
                        (char (*) [2])CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8))
      ;
      Print::~Print(in_stack_fffffffffffff130);
    }
    plVar1 = *(long **)(in_RDI + 0x12);
    Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
    ::operator[]((Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                  *)in_stack_fffffffffffff0c0,
                 CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
    pAVar4 = Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                       ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)in_stack_fffffffffffff0c0
                        ,CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
    (**(code **)(*plVar1 + 0x170))(plVar1,pAVar4);
    local_801 = 1;
    for (local_808 = 0; iVar3 = local_c, iVar2 = local_14, local_808 < in_RDI[3];
        local_808 = local_808 + 1) {
      plVar1 = *(long **)(in_RDI + 0x12);
      Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
      ::operator[]((Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                    *)in_stack_fffffffffffff0c0,
                   CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
      pAVar4 = Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                         ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)
                          in_stack_fffffffffffff0c0,
                          CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
      Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
      ::operator[]((Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                    *)in_stack_fffffffffffff0c0,
                   CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
      pAVar5 = Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                         ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)
                          in_stack_fffffffffffff0c0,
                          CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
      (**(code **)(*plVar1 + 0x1c8))(plVar1,iVar3,iVar2,pAVar4,pAVar5,local_801 & 1);
      local_801 = 0;
    }
    local_99c = local_14;
    if (3 < *in_RDI) {
      computeResOfCorrection
                (in_stack_fffffffffffff0f0,(int)((ulong)in_stack_fffffffffffff0e8 >> 0x20),
                 (int)in_stack_fffffffffffff0e8);
      in_stack_fffffffffffff180 = *(MLMG **)(in_RDI + 0x12);
      Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
      ::operator[]((Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                    *)in_stack_fffffffffffff0c0,
                   CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
      pAVar4 = Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                         ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)
                          in_stack_fffffffffffff0c0,
                          CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
      local_810 = (**(code **)(*(long *)in_stack_fffffffffffff180 + 400))
                            (in_stack_fffffffffffff180,pAVar4);
      OutStream();
      Print::Print((Print *)in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8);
      Print::operator<<((Print *)in_stack_fffffffffffff0c0,
                        (char (*) [10])CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8)
                       );
      in_stack_fffffffffffff178 =
           Print::operator<<((Print *)in_stack_fffffffffffff0c0,
                             (int *)CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
      Print::operator<<((Print *)in_stack_fffffffffffff0c0,
                        (char (*) [2])CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8))
      ;
      Print::operator<<((Print *)in_stack_fffffffffffff0c0,
                        (int *)CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
      Print::operator<<((Print *)in_stack_fffffffffffff0c0,
                        (char (*) [27])CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8)
                       );
      Print::operator<<((Print *)in_stack_fffffffffffff0c0,
                        (double *)CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
      Print::operator<<((Print *)in_stack_fffffffffffff0c0,
                        (char (*) [2])CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8))
      ;
      Print::~Print(in_stack_fffffffffffff130);
      local_99c = local_14;
    }
  }
  while (local_99c = local_99c + -1, local_10 <= local_99c) {
    addInterpCorrection(in_stack_fffffffffffff180,(int)((ulong)in_stack_fffffffffffff178 >> 0x20),
                        (int)in_stack_fffffffffffff178);
    if (3 < *in_RDI) {
      computeResOfCorrection
                (in_stack_fffffffffffff0f0,(int)((ulong)in_stack_fffffffffffff0e8 >> 0x20),
                 (int)in_stack_fffffffffffff0e8);
      plVar1 = *(long **)(in_RDI + 0x12);
      Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
      ::operator[]((Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                    *)in_stack_fffffffffffff0c0,
                   CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
      pAVar4 = Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                         ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)
                          in_stack_fffffffffffff0c0,
                          CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
      local_9a8 = (**(code **)(*plVar1 + 400))(plVar1,pAVar4);
      OutStream();
      Print::Print((Print *)in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8);
      Print::operator<<((Print *)in_stack_fffffffffffff0c0,
                        (char (*) [10])CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8)
                       );
      Print::operator<<((Print *)in_stack_fffffffffffff0c0,
                        (int *)CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
      in_stack_fffffffffffff130 =
           Print::operator<<((Print *)in_stack_fffffffffffff0c0,
                             (char (*) [2])
                             CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
      Print::operator<<((Print *)in_stack_fffffffffffff0c0,
                        (int *)CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
      Print::operator<<((Print *)in_stack_fffffffffffff0c0,
                        (char (*) [27])CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8)
                       );
      Print::operator<<((Print *)in_stack_fffffffffffff0c0,
                        (double *)CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
      Print::operator<<((Print *)in_stack_fffffffffffff0c0,
                        (char (*) [2])CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8))
      ;
      Print::~Print(in_stack_fffffffffffff130);
    }
    for (local_cc8.m_iter_fine_resnorm0.super_vector<double,_std::allocator<double>_>.
         super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._4_4_ = 0; iVar3 = local_c, iVar2 = local_99c,
        local_cc8.m_iter_fine_resnorm0.super_vector<double,_std::allocator<double>_>.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ < in_RDI[4];
        local_cc8.m_iter_fine_resnorm0.super_vector<double,_std::allocator<double>_>.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ =
             local_cc8.m_iter_fine_resnorm0.super_vector<double,_std::allocator<double>_>.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage._4_4_ + 1) {
      plVar1 = *(long **)(in_RDI + 0x12);
      Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
      ::operator[]((Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                    *)in_stack_fffffffffffff0c0,
                   CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
      pAVar4 = Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                         ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)
                          in_stack_fffffffffffff0c0,
                          CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
      Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
      ::operator[]((Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                    *)in_stack_fffffffffffff0c0,
                   CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
      pAVar5 = Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                         ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)
                          in_stack_fffffffffffff0c0,
                          CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
      (**(code **)(*plVar1 + 0x1c8))(plVar1,iVar3,iVar2,pAVar4,pAVar5,0);
    }
    if (in_RDI[9] == 1) {
      computeResOfCorrection
                (in_stack_fffffffffffff0f0,(int)((ulong)in_stack_fffffffffffff0e8 >> 0x20),
                 (int)in_stack_fffffffffffff0e8);
    }
    if (3 < *in_RDI) {
      computeResOfCorrection
                (in_stack_fffffffffffff0f0,(int)((ulong)in_stack_fffffffffffff0e8 >> 0x20),
                 (int)in_stack_fffffffffffff0e8);
      in_stack_fffffffffffff0e8 = *(ostream **)(in_RDI + 0x12);
      Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
      ::operator[]((Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                    *)in_stack_fffffffffffff0c0,
                   CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
      pAVar4 = Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                         ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)
                          in_stack_fffffffffffff0c0,
                          CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
      local_cc8.m_iter_fine_resnorm0.super_vector<double,_std::allocator<double>_>.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
           = (pointer)(**(code **)(*(long *)in_stack_fffffffffffff0e8 + 400))
                                (in_stack_fffffffffffff0e8,pAVar4);
      OutStream();
      in_stack_fffffffffffff0f0 = &local_cc8;
      Print::Print((Print *)in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8);
      Print::operator<<((Print *)in_stack_fffffffffffff0c0,
                        (char (*) [10])CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8)
                       );
      Print::operator<<((Print *)in_stack_fffffffffffff0c0,
                        (int *)CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
      Print::operator<<((Print *)in_stack_fffffffffffff0c0,
                        (char (*) [2])CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8))
      ;
      Print::operator<<((Print *)in_stack_fffffffffffff0c0,
                        (int *)CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
      Print::operator<<((Print *)in_stack_fffffffffffff0c0,
                        (char (*) [27])CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8)
                       );
      in_stack_fffffffffffff0c0 =
           (MLLinOp *)
           Print::operator<<((Print *)in_stack_fffffffffffff0c0,
                             (double *)CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8)
                            );
      Print::operator<<((Print *)in_stack_fffffffffffff0c0,
                        (char (*) [2])CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8))
      ;
      Print::~Print(in_stack_fffffffffffff130);
    }
  }
  return;
}

Assistant:

void
MLMG::mgVcycle (int amrlev, int mglev_top)
{
    BL_PROFILE("MLMG::mgVcycle()");

    const int mglev_bottom = linop.NMGLevels(amrlev) - 1;

    for (int mglev = mglev_top; mglev < mglev_bottom; ++mglev)
    {
        BL_PROFILE_VAR("MLMG::mgVcycle_down::"+std::to_string(mglev), blp_mgv_down_lev);

        if (verbose >= 4)
        {
            Real norm = linop.AnyNormInf(res[amrlev][mglev]);
            amrex::Print() << "AT LEVEL "  << amrlev << " " << mglev
                           << "   DN: Norm before smooth " << norm << "\n";
        }

        linop.AnySetToZero(cor[amrlev][mglev]);
        bool skip_fillboundary = true;
        for (int i = 0; i < nu1; ++i) {
            linop.AnySmooth(amrlev, mglev, cor[amrlev][mglev], res[amrlev][mglev],
                            skip_fillboundary);
            skip_fillboundary = false;
        }

        // rescor = res - L(cor)
        computeResOfCorrection(amrlev, mglev);

        if (verbose >= 4)
        {
            Real norm = linop.AnyNormInf(rescor[amrlev][mglev]);
            amrex::Print() << "AT LEVEL "  << amrlev << " " << mglev
                           << "   DN: Norm after  smooth " << norm << "\n";
        }

        // res_crse = R(rescor_fine); this provides res/b to the level below
        linop.AnyRestriction(amrlev, mglev+1, res[amrlev][mglev+1], rescor[amrlev][mglev]);
    }

    BL_PROFILE_VAR("MLMG::mgVcycle_bottom", blp_bottom);
    if (amrlev == 0)
    {
        if (verbose >= 4)
        {
            Real norm = linop.AnyNormInf(res[amrlev][mglev_bottom]);
            amrex::Print() << "AT LEVEL "  << amrlev << " " << mglev_bottom
                           << "   DN: Norm before bottom " << norm << "\n";
        }
        bottomSolve();
        if (verbose >= 4)
        {
            computeResOfCorrection(amrlev, mglev_bottom);
            Real norm = linop.AnyNormInf(rescor[amrlev][mglev_bottom]);

            amrex::Print() << "AT LEVEL "  << amrlev << " " << mglev_bottom
                           << "   UP: Norm after  bottom " << norm << "\n";
        }
    }
    else
    {
        if (verbose >= 4)
        {
            Real norm = linop.AnyNormInf(res[amrlev][mglev_bottom]);
            amrex::Print() << "AT LEVEL "  << amrlev << " " << mglev_bottom
                           << "       Norm before smooth " << norm << "\n";
        }
        linop.AnySetToZero(cor[amrlev][mglev_bottom]);
        bool skip_fillboundary = true;
        for (int i = 0; i < nu1; ++i) {
            linop.AnySmooth(amrlev, mglev_bottom, cor[amrlev][mglev_bottom],
                            res[amrlev][mglev_bottom], skip_fillboundary);
            skip_fillboundary = false;
        }
        if (verbose >= 4)
        {
            computeResOfCorrection(amrlev, mglev_bottom);
            Real norm = linop.AnyNormInf(rescor[amrlev][mglev_bottom]);
            amrex::Print() << "AT LEVEL "  << amrlev  << " " << mglev_bottom
                           << "       Norm after  smooth " << norm << "\n";
        }
    }
    BL_PROFILE_VAR_STOP(blp_bottom);

    for (int mglev = mglev_bottom-1; mglev >= mglev_top; --mglev)
    {
        BL_PROFILE_VAR("MLMG::mgVcycle_up::"+std::to_string(mglev), blp_mgv_up_lev);
        // cor_fine += I(cor_crse)
        addInterpCorrection(amrlev, mglev);
        if (verbose >= 4)
        {
            computeResOfCorrection(amrlev, mglev);
            Real norm = linop.AnyNormInf(rescor[amrlev][mglev]);
            amrex::Print() << "AT LEVEL "  << amrlev << " " << mglev
                           << "   UP: Norm before smooth " << norm << "\n";
        }
        for (int i = 0; i < nu2; ++i) {
            linop.AnySmooth(amrlev, mglev, cor[amrlev][mglev], res[amrlev][mglev]);
        }

        if (cf_strategy == CFStrategy::ghostnodes) computeResOfCorrection(amrlev, mglev);

        if (verbose >= 4)
        {
            computeResOfCorrection(amrlev, mglev);
            Real norm = linop.AnyNormInf(rescor[amrlev][mglev]);
            amrex::Print() << "AT LEVEL "  << amrlev << " " << mglev
                           << "   UP: Norm after  smooth " << norm << "\n";
        }
    }
}